

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaPValAttrNode
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaBasicItemPtr ownerItem,xmlAttrPtr attr,
              xmlSchemaTypePtr type,xmlChar **value)

{
  int iVar1;
  xmlAttrPtr attr_00;
  
  if (ownerItem == (xmlSchemaBasicItemPtr)0x0 || attr == (xmlAttrPtr)0x0) {
    return -1;
  }
  attr_00 = (xmlAttrPtr)xmlSchemaGetNodeContent(ctxt,(xmlNodePtr)ownerItem);
  if (type != (xmlSchemaTypePtr)0x0) {
    *(xmlAttrPtr *)type = attr_00;
  }
  iVar1 = xmlSchemaPValAttrNodeValue(ctxt,ownerItem,attr_00,(xmlChar *)attr,(xmlSchemaTypePtr)value)
  ;
  return iVar1;
}

Assistant:

static int
xmlSchemaPValAttrNode(xmlSchemaParserCtxtPtr ctxt,
			   xmlSchemaBasicItemPtr ownerItem,
			   xmlAttrPtr attr,
			   xmlSchemaTypePtr type,
			   const xmlChar **value)
{
    const xmlChar *val;

    if ((ctxt == NULL) || (type == NULL) || (attr == NULL))
	return (-1);

    val = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
    if (value != NULL)
	*value = val;

    return (xmlSchemaPValAttrNodeValue(ctxt, ownerItem, attr,
	val, type));
}